

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O2

void __thiscall
QSequentialAnimationGroupPrivate::activateCurrentAnimation
          (QSequentialAnimationGroupPrivate *this,bool intermediate)

{
  QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
  *this_00;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *this_01;
  QAbstractAnimation *this_02;
  parameter_type pVar1;
  parameter_type direction;
  int iVar2;
  parameter_type pQVar3;
  
  this_01 = &this->currentAnimation;
  pQVar3 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
           ::value(this_01);
  if (pQVar3 != (parameter_type)0x0) {
    this_00 = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.state;
    pVar1 = QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
            ::value(this_00);
    if (pVar1 != Stopped) {
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::value(this_01);
      QAbstractAnimation::stop
                ((QAbstractAnimation *)
                 (this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val);
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::value(this_01);
      this_02 = (QAbstractAnimation *)
                (this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val;
      direction = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                  ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                           direction);
      QAbstractAnimation::setDirection(this_02,direction);
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::value(this_01);
      iVar2 = QAbstractAnimation::totalDuration
                        ((QAbstractAnimation *)
                         (this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val);
      if (iVar2 == -1) {
        pQVar3 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                 ::value(this_01);
        QAnimationGroupPrivate::connectUncontrolledAnimation
                  (&this->super_QAnimationGroupPrivate,pQVar3);
      }
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::value(this_01);
      QAbstractAnimation::start
                ((QAbstractAnimation *)(this_01->super_QPropertyData<QAbstractAnimation_*>).val,
                 KeepWhenStopped);
      if (!intermediate) {
        pVar1 = QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                ::value(this_00);
        if (pVar1 == Paused) {
          QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
          ::value(this_01);
          QAbstractAnimation::pause
                    ((QAbstractAnimation *)(this_01->super_QPropertyData<QAbstractAnimation_*>).val)
          ;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::activateCurrentAnimation(bool intermediate)
{
    if (!currentAnimation || state == QSequentialAnimationGroup::Stopped)
        return;

    currentAnimation->stop();

    // we ensure the direction is consistent with the group's direction
    currentAnimation->setDirection(direction);

    // connects to the finish signal of uncontrolled animations
    if (currentAnimation->totalDuration() == -1)
        connectUncontrolledAnimation(currentAnimation);

    currentAnimation->start();
    if (!intermediate && state == QSequentialAnimationGroup::Paused)
        currentAnimation->pause();
}